

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O2

void __thiscall Klex::Klex(Klex *this,char *filepath)

{
  FILE *pFVar1;
  undefined8 *puVar2;
  
  (this->lexToTokenTable)._M_h._M_buckets = &(this->lexToTokenTable)._M_h._M_single_bucket;
  (this->lexToTokenTable)._M_h._M_bucket_count = 1;
  (this->lexToTokenTable)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->lexToTokenTable)._M_h._M_element_count = 0;
  (this->lexToTokenTable)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->lexToTokenTable)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->lexToTokenTable)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->currentChar = 0;
  this->charClass = OTHER;
  this->tokenType = Unknown;
  (this->lexeme)._M_dataplus._M_p = (pointer)&(this->lexeme).field_2;
  (this->lexeme)._M_string_length = 0;
  (this->lexeme).field_2._M_local_buf[0] = '\0';
  this->lineNum = 1;
  this->colNum = 0;
  *(undefined4 *)((long)&this->colNum + 7) = 0;
  pFVar1 = fopen(filepath,"r");
  this->file = (FILE *)pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    initLexToTokenTable(this);
    nextChar(this);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "Could not open file!";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

Klex::Klex(const char* filepath) {
    file = fopen(filepath, "r");
    if(!file)
        throw "Could not open file!";
    initLexToTokenTable();

    nextChar();
}